

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHdrWrapper.cpp
# Opt level: O2

QString * __thiscall
FileHdrWrapper::translateFieldContent
          (QString *__return_storage_ptr__,FileHdrWrapper *this,size_t fieldId)

{
  Executable *pEVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  PEFile *this_00;
  
  iVar3 = (*(this->super_PEElementWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])(this);
  if (CONCAT44(extraout_var,iVar3) != 0) {
    if (fieldId == 2) {
      pEVar1 = (this->super_PEElementWrapper).super_ExeElementWrapper.m_Exe;
      if (((pEVar1 == (Executable *)0x0) ||
          (this_00 = (PEFile *)__dynamic_cast(pEVar1,&Executable::typeinfo,&PEFile::typeinfo,0),
          this_00 == (PEFile *)0x0)) || (bVar2 = PEFile::isReproBuild(this_00), !bVar2)) {
        util::getDateString(__return_storage_ptr__,
                            (ulong)*(uint *)(CONCAT44(extraout_var,iVar3) + 4));
        return __return_storage_ptr__;
      }
    }
    else if (fieldId == 0) {
      translateMachine(0);
      return __return_storage_ptr__;
    }
  }
  QString::QString(__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

QString FileHdrWrapper::translateFieldContent(size_t fieldId)
{
    IMAGE_FILE_HEADER * hdr = reinterpret_cast<IMAGE_FILE_HEADER*>(getPtr());
    if (!hdr) return "";

    IMAGE_FILE_HEADER &fileHeader = (*hdr);
    switch (fieldId) {
        case MACHINE: return FileHdrWrapper::translateMachine(fileHeader.Machine);
        case TIMESTAMP: {
            PEFile* myPe = dynamic_cast<PEFile*>(this->m_Exe);
            if (myPe && myPe->isReproBuild()) {
                return ""; // This is not a real timestamp
            }
            return util::getDateString(fileHeader.TimeDateStamp);
        }
    }
    return "";
}